

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4447fb::CastExpr::printLeft(CastExpr *this,OutputStream *S)

{
  StringView local_58;
  StringView local_48;
  StringView local_38;
  char *local_28;
  char *local_20;
  OutputStream *local_18;
  OutputStream *S_local;
  CastExpr *this_local;
  
  local_28 = (this->CastKind).First;
  local_20 = (this->CastKind).Last;
  local_18 = S;
  S_local = (OutputStream *)this;
  OutputStream::operator+=(S,this->CastKind);
  StringView::StringView(&local_38,"<");
  OutputStream::operator+=(local_18,local_38);
  (*this->To->_vptr_Node[4])(this->To,local_18);
  StringView::StringView(&local_48,">(");
  OutputStream::operator+=(local_18,local_48);
  (*this->From->_vptr_Node[4])(this->From,local_18);
  StringView::StringView(&local_58,")");
  OutputStream::operator+=(local_18,local_58);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += CastKind;
    S += "<";
    To->printLeft(S);
    S += ">(";
    From->printLeft(S);
    S += ")";
  }